

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pointer.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall
duckdb::ColumnSegmentState::Deserialize(ColumnSegmentState *this,Deserializer *deserializer)

{
  SerializationData *this_00;
  CompressionType type;
  DatabaseInstance *db;
  LogicalType *pLVar1;
  DBConfig *this_01;
  CompressionFunction *pCVar2;
  SerializationException *this_02;
  allocator local_51;
  optional_ptr<duckdb::CompressionFunction,_true> compression_function;
  string local_48;
  
  this_00 = &deserializer->data;
  type = SerializationData::Get<duckdb::CompressionType>(this_00);
  db = SerializationData::Get<duckdb::DatabaseInstance&>(this_00);
  pLVar1 = SerializationData::Get<duckdb::LogicalType_const&>(this_00);
  this_01 = DBConfig::GetConfig(db);
  compression_function = DBConfig::GetCompressionFunction(this_01,type,pLVar1->physical_type_);
  if (compression_function.ptr != (CompressionFunction *)0x0) {
    pCVar2 = optional_ptr<duckdb::CompressionFunction,_true>::operator->(&compression_function);
    if (pCVar2->deserialize_state != (compression_deserialize_state_t)0x0) {
      pCVar2 = optional_ptr<duckdb::CompressionFunction,_true>::operator->(&compression_function);
      (*pCVar2->deserialize_state)((Deserializer *)this);
      return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
              )(unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
                )this;
    }
  }
  this_02 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Deserializing a ColumnSegmentState but could not find deserialize method",&local_51);
  SerializationException::SerializationException(this_02,&local_48);
  __cxa_throw(this_02,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnSegmentState> ColumnSegmentState::Deserialize(Deserializer &deserializer) {
	auto compression_type = deserializer.Get<CompressionType>();
	auto &db = deserializer.Get<DatabaseInstance &>();
	auto &type = deserializer.Get<const LogicalType &>();

	auto compression_function = DBConfig::GetConfig(db).GetCompressionFunction(compression_type, type.InternalType());
	if (!compression_function || !compression_function->deserialize_state) {
		throw SerializationException("Deserializing a ColumnSegmentState but could not find deserialize method");
	}
	return compression_function->deserialize_state(deserializer);
}